

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetDeviceEnableMetricsExp(zet_device_handle_t hDevice)

{
  zet_pfnDeviceEnableMetricsExp_t pfnEnableMetricsExp;
  ze_result_t result;
  zet_device_handle_t hDevice_local;
  
  pfnEnableMetricsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c810 != (code *)0x0) {
    pfnEnableMetricsExp._4_4_ = (*DAT_0011c810)(hDevice);
  }
  return pfnEnableMetricsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceEnableMetricsExp(
        zet_device_handle_t hDevice                     ///< [in] handle of the device where metrics collection has to be enabled.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnEnableMetricsExp = context.zetDdiTable.DeviceExp.pfnEnableMetricsExp;
        if( nullptr != pfnEnableMetricsExp )
        {
            result = pfnEnableMetricsExp( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }